

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseLookupString(xmlParserCtxtPtr ctxt,size_t startDelta,char *str,size_t strLen)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  long lVar4;
  xmlChar *__haystack;
  xmlChar *pxVar5;
  
  if (ctxt->checkIndex != 0) {
    startDelta = ctxt->checkIndex;
  }
  __haystack = ctxt->input->cur + startDelta;
  pxVar2 = (xmlChar *)strstr((char *)__haystack,str);
  if (pxVar2 == (xmlChar *)0x0) {
    pxVar1 = ctxt->input->end;
    pxVar3 = pxVar1 + -strLen;
    pxVar5 = pxVar3 + 1;
    if ((ulong)((long)pxVar1 - (long)__haystack) < strLen) {
      pxVar5 = __haystack;
    }
    lVar4 = (long)pxVar5 - (long)ctxt->input->cur;
    if (lVar4 < 0) {
      ctxt->checkIndex = 0;
      pxVar2 = pxVar3;
    }
    else {
      ctxt->checkIndex = lVar4;
    }
  }
  else {
    ctxt->checkIndex = 0;
  }
  return pxVar2;
}

Assistant:

static const xmlChar *
xmlParseLookupString(xmlParserCtxtPtr ctxt, size_t startDelta,
                     const char *str, size_t strLen) {
    const xmlChar *cur, *term;

    if (ctxt->checkIndex == 0) {
        cur = ctxt->input->cur + startDelta;
    } else {
        cur = ctxt->input->cur + ctxt->checkIndex;
    }

    term = BAD_CAST strstr((const char *) cur, str);
    if (term == NULL) {
        const xmlChar *end = ctxt->input->end;
        size_t index;

        /* Rescan (strLen - 1) characters. */
        if ((size_t) (end - cur) < strLen)
            end = cur;
        else
            end -= strLen - 1;
        index = end - ctxt->input->cur;
        if (index > LONG_MAX) {
            ctxt->checkIndex = 0;
            return(ctxt->input->end - strLen);
        }
        ctxt->checkIndex = index;
    } else {
        ctxt->checkIndex = 0;
    }

    return(term);
}